

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

bool __thiscall BufferedFile::Fill(BufferedFile *this)

{
  long lVar1;
  pointer pbVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  Span<std::byte> dst;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pbVar2;
  uVar3 = this->nSrcPos % uVar10;
  iVar5 = (int)uVar10;
  uVar4 = iVar5 - (int)uVar3;
  uVar9 = (iVar5 + (int)this->m_read_pos) - ((int)this->nSrcPos + (int)this->nRewind);
  if (uVar4 <= uVar9) {
    uVar9 = uVar4;
  }
  if (uVar9 != 0) {
    dst.m_data = pbVar2 + (uVar3 & 0xffffffff);
    dst.m_size._0_4_ = uVar9;
    dst.m_size._4_4_ = 0;
    sVar6 = AutoFile::detail_fread(this->m_src,dst);
    if (sVar6 == 0) {
      pcVar7 = (char *)__cxa_allocate_exception(0x20);
      iVar5 = feof((FILE *)this->m_src->m_file);
      pcVar8 = "BufferedFile::Fill: end of file";
      if (iVar5 == 0) {
        pcVar8 = "BufferedFile::Fill: fread failed";
      }
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure(pcVar7,(error_code *)pcVar8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00663265;
    }
    this->nSrcPos = this->nSrcPos + sVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar9 != 0;
  }
LAB_00663265:
  __stack_chk_fail();
}

Assistant:

bool Fill() {
        unsigned int pos = nSrcPos % vchBuf.size();
        unsigned int readNow = vchBuf.size() - pos;
        unsigned int nAvail = vchBuf.size() - (nSrcPos - m_read_pos) - nRewind;
        if (nAvail < readNow)
            readNow = nAvail;
        if (readNow == 0)
            return false;
        size_t nBytes{m_src.detail_fread(Span{vchBuf}.subspan(pos, readNow))};
        if (nBytes == 0) {
            throw std::ios_base::failure{m_src.feof() ? "BufferedFile::Fill: end of file" : "BufferedFile::Fill: fread failed"};
        }
        nSrcPos += nBytes;
        return true;
    }